

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O0

int rf_send(rf_dev_t *dev,uint8_t *data,size_t len)

{
  int iVar1;
  ulong local_40;
  ulong local_38;
  byte local_2e;
  byte local_2d;
  int local_2c;
  uint8_t val;
  uint8_t send_len;
  size_t sStack_28;
  int err;
  size_t len_local;
  uint8_t *data_local;
  rf_dev_t *dev_local;
  
  local_2c = 1;
  local_38 = len;
  if (0x42 < len) {
    local_38 = 0x42;
  }
  local_2d = (byte)local_38;
  sStack_28 = len;
  len_local = (size_t)data;
  data_local = (uint8_t *)dev;
  local_2c = spi_write_regs(dev->fd,'\0',data,local_38 & 0xff);
  if (local_2c == 0) {
    len_local = len_local + (long)(int)(uint)local_2d;
    sStack_28 = sStack_28 - local_2d;
    local_2c = _switch_mode((rf_dev_t *)data_local,0xc);
    if (local_2c == 0) {
      for (; sStack_28 != 0; sStack_28 = sStack_28 - local_2d) {
        do {
          local_2c = 0;
          local_2c = spi_read_reg(*(int *)data_local,'(',&local_2e);
          if (local_2c != 0) {
            return local_2c;
          }
        } while ((local_2e & 0x20) != 0);
        if ((ulong)(long)(int)(0x42 - (uint)data_local[4]) < sStack_28) {
          local_40 = (ulong)(int)(0x42 - (uint)data_local[4]);
        }
        else {
          local_40 = sStack_28;
        }
        local_2d = (byte)local_40;
        iVar1 = spi_write_regs(*(int *)data_local,'\0',(uint8_t *)len_local,local_40 & 0xff);
        if (iVar1 != 0) {
          return iVar1;
        }
        len_local = len_local + (long)(int)(uint)local_2d;
      }
      do {
        local_2c = 0;
        local_2c = spi_read_reg(*(int *)data_local,'(',&local_2e);
        if (local_2c != 0) {
          return local_2c;
        }
      } while ((local_2e & 8) == 0);
      local_2c = _switch_mode((rf_dev_t *)data_local,4);
      if (local_2c == 0) {
        return 0;
      }
    }
  }
  return local_2c;
}

Assistant:

int rf_send(rf_dev_t *dev, const uint8_t *data, size_t len)
{
	int err = ERR_UNSPEC;
	uint8_t send_len;
	uint8_t val;

	// Prefill Fifo
	send_len = (len <= SX1231_FIFO_SIZE) ? len : SX1231_FIFO_SIZE;
	TRY(spi_write_regs(dev->fd, RegFifo, data, send_len));
	data += send_len;
	len -= send_len;

	// Start TX
	TRY(_switch_mode(dev, OP_MODE_MODE_TX));

	while (len != 0) {
		// Wait till space in FIFO
		do {
			TRY(spi_read_reg(dev->fd, RegIrqFlags2, &val));
		} while (val & IRQ_FLAGS2_FIFOLEVEL);

		// Refill Fifo
		send_len = (len <= SX1231_FIFO_SIZE - dev->fifo_thresh) ? len : (SX1231_FIFO_SIZE - dev->fifo_thresh);
		TRY(spi_write_regs(dev->fd, RegFifo, data, send_len));
		data += send_len;
		len -= send_len;
	}

	// Wait till done
	do {
		TRY(spi_read_reg(dev->fd, RegIrqFlags2, &val));
	} while (! (val & IRQ_FLAGS2_PACKETSENT));

	TRY(_switch_mode(dev, OP_MODE_MODE_STDBY));

	return ERR_OK;
fail:
	return err;
}